

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixEnv::StartThread
          (PosixEnv *this,_func_void_void_ptr *thread_main,void *thread_main_arg)

{
  thread new_thread;
  thread local_20;
  void *local_18;
  _func_void_void_ptr *local_10;
  
  local_18 = thread_main_arg;
  local_10 = thread_main;
  std::thread::thread<void(*&)(void*),void*&,void>(&local_20,&local_10,&local_18);
  std::thread::detach();
  std::thread::~thread(&local_20);
  return;
}

Assistant:

void PosixEnv::StartThread(void (*thread_main)(void* thread_main_arg),
                           void* thread_main_arg) {
  std::thread new_thread(thread_main, thread_main_arg);
  new_thread.detach();
}